

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d60_q0_zipcode.cpp
# Opt level: O2

bool __thiscall Letter::operator<(Letter *this,Letter *other)

{
  Letter *pLVar1;
  Letter *pLVar2;
  bool bVar3;
  
  if (this->zip != other->zip) {
    return this->zip < other->zip;
  }
  bVar3 = std::operator!=(&this->address,&other->address);
  pLVar1 = (Letter *)&other->address;
  pLVar2 = (Letter *)&this->address;
  if (!bVar3) {
    bVar3 = std::operator!=(&this->district,&other->district);
    pLVar1 = (Letter *)&other->district;
    pLVar2 = (Letter *)&this->district;
    if (!bVar3) {
      bVar3 = std::operator!=(&this->province,&other->province);
      pLVar1 = (Letter *)&other->province;
      pLVar2 = (Letter *)&this->province;
      if (!bVar3) goto LAB_001033b9;
    }
  }
  this = pLVar2;
  other = pLVar1;
LAB_001033b9:
  bVar3 = std::operator<(&this->name,&other->name);
  return bVar3;
}

Assistant:

bool operator<(const Letter &other) const {
        //**Begin Insert**
        if (this->zip != other.zip)  {
            return this->zip < other.zip;
        }
        else if (this->address != other.address) {
            return this->address < other.address;
        }
        else if (this->district != other.district) {
            return this->district < other.district;
        }
        else if (this->province != other.province) {
            return this->province < other.province;
        }
        else {
            return this->name < other.name;
        }
        //**End Insert**
    }